

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O1

shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_event_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload,uint32_t *rid)

{
  long lVar1;
  undefined8 uVar2;
  MiniBusClient *__args_1;
  error_category *peVar3;
  result_type rVar4;
  ulong uVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar11;
  MiniBusEncoder encoder;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tok;
  unique_lock<std::mutex> lock;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  MiniBusClient *local_c0;
  uint32_t *local_b8;
  size_t local_b0;
  char *local_a8;
  int local_a0;
  uint uStack_9c;
  error_category *local_98;
  unique_lock<std::mutex> local_90;
  system_error local_80;
  undefined1 *local_40;
  undefined1 *local_38;
  
  local_b0 = payload._M_len;
  local_a8 = command._M_str;
  sVar8 = command._M_len;
  local_90._M_device = (mutex_type *)(sVar8 + 0x13a8);
  local_90._M_owns = false;
  local_c0 = this;
  local_b8 = rid;
  std::unique_lock<std::mutex>::lock(&local_90);
  local_90._M_owns = true;
  lVar1 = sVar8 + 0x13d8;
  do {
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)(sVar8 + 0x13a0),
                       (random_device *)(sVar8 + 0x18),(param_type *)(sVar8 + 0x13a0));
    uVar5 = (ulong)rVar4;
    lVar6 = lVar1;
    for (lVar9 = *(long *)(sVar8 + 0x13e0); lVar9 != 0;
        lVar9 = *(long *)(lVar9 + 0x10 + (ulong)bVar10 * 8)) {
      bVar10 = *(ulong *)(lVar9 + 0x20) < uVar5;
      if (!bVar10) {
        lVar6 = lVar9;
      }
    }
    lVar9 = lVar1;
    if ((lVar6 != lVar1) && (lVar9 = lVar6, uVar5 < *(ulong *)(lVar6 + 0x20))) {
      lVar9 = lVar1;
    }
  } while (lVar9 != lVar1);
  *(result_type *)encoder.buffer._M_dataplus._M_p = rVar4;
  local_d8 = (undefined1 *)0x0;
  local_d0 = 0;
  local_80._0_4_ = rVar4;
  local_e0 = &local_d0;
  std::__cxx11::string::append((char *)&local_e0,(ulong)&local_80);
  std::__cxx11::string::push_back((char)&local_e0);
  std::__cxx11::string::append((char *)&local_e0,local_b0);
  std::__cxx11::string::reserve((ulong)&local_e0);
  if ((char *)0x7f < payload._M_str) {
    pcVar7 = payload._M_str;
    do {
      std::__cxx11::string::push_back((char)&local_e0);
      bVar10 = (char *)0x3fff < pcVar7;
      pcVar7 = (char *)((ulong)pcVar7 >> 7);
    } while (bVar10);
  }
  std::__cxx11::string::push_back((char)&local_e0);
  std::__cxx11::string::append((char *)&local_e0,(ulong)local_b8);
  local_40 = local_d8;
  if (local_d8 != (undefined1 *)0x0) {
    local_40 = local_e0;
  }
  local_80._0_8_ = &local_40;
  local_38 = local_d8;
  local_a0 = 0;
  uStack_9c = uStack_9c & 0xffffff00;
  local_98 = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
            (sVar8 + 0x1460);
  peVar3 = local_98;
  __args_1 = local_c0;
  if ((char)uStack_9c == '\x01') {
    uVar2._4_4_ = uStack_9c;
    uVar2._0_4_ = local_a0;
    std::runtime_error::runtime_error(&local_80.super_runtime_error,"write");
    local_80.m_what._M_dataplus._M_p = (pointer)&local_80.m_what.field_2;
    local_80._0_8_ = &PTR__system_error_0011eb10;
    local_80.m_error_code.cat_ = peVar3;
    local_80.m_what._M_string_length = 0;
    local_80.m_what.field_2._M_local_buf[0] = '\0';
    local_80.m_error_code._0_8_ = uVar2;
    boost::throw_exception<boost::system::system_error>(&local_80);
  }
  *(undefined8 *)local_c0 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>,std::allocator<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0->info,
             (SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)local_c0,
             (allocator<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_80);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  _M_emplace_unique<unsigned_int&,std::shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>&>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)(sVar8 + 0x13d0),(uint *)encoder.buffer._M_dataplus._M_p,
             (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)__args_1);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  sVar11.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar11.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)__args_1;
  return (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar11.
           super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<SyncNotifyToken<std::optional<std::string>>>
  send_event(std::string_view command, std::string_view payload, uint32_t &rid) {
    std::unique_lock lock{mtx};
    rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<SyncNotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }